

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

string * nlohmann::json_abi_v3_11_3::detail::
         serializer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
         ::hex_bytes(string *__return_storage_ptr__,uint8_t byte)

{
  undefined7 in_register_00000031;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"FF","");
  *(__return_storage_ptr__->_M_dataplus)._M_p =
       "0123456789ABCDEF"[(CONCAT71(in_register_00000031,byte) & 0xffffffff) >> 4];
  (__return_storage_ptr__->_M_dataplus)._M_p[1] =
       "0123456789ABCDEF"[(uint)CONCAT71(in_register_00000031,byte) & 0xf];
  return __return_storage_ptr__;
}

Assistant:

static std::string hex_bytes(std::uint8_t byte)
    {
        std::string result = "FF";
        constexpr const char* nibble_to_hex = "0123456789ABCDEF";
        result[0] = nibble_to_hex[byte / 16];
        result[1] = nibble_to_hex[byte % 16];
        return result;
    }